

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool SetCachedTextureCoordinatesFromMaterial
               (ON_Mesh *mesh,
               function<ON_TextureMapping_(const_ON_MappingChannel_*)> *get_mapping_func,
               ON_Material *material,ON_MappingRef *mapping_ref,
               ON_SimpleArray<ON_TextureMapping::TYPE> *mappings_to_cache,bool perform_cleanup)

{
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> get_mapping_func_00;
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> get_mapping_func_01;
  bool bVar1;
  bool bVar2;
  ON_TextureCoordinates *this;
  int ti;
  long lVar3;
  long lVar4;
  ON_Xform *pOVar5;
  ON_Xform *pOVar6;
  undefined4 uVar7;
  undefined7 in_register_00000089;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  undefined4 uStack_3d8;
  ON_SimpleArray<const_ON_Mesh_*> meshes;
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> local_3a8;
  ON_UUID uuidWcsMapping;
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> local_368;
  undefined1 local_348 [32];
  unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
  per_vertex_channels;
  ON_UUID uuidWcsBoxMapping;
  ON_Xform ocsTransform;
  ON_TextureMapping wcsMapping;
  
  bVar10 = 0;
  uVar7 = (undefined4)CONCAT71(in_register_00000089,perform_cleanup);
  per_vertex_channels._M_h._M_buckets = &per_vertex_channels._M_h._M_single_bucket;
  per_vertex_channels._M_h._M_bucket_count = 1;
  per_vertex_channels._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  per_vertex_channels._M_h._M_element_count = 0;
  per_vertex_channels._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  per_vertex_channels._M_h._M_rehash_policy._M_next_resize = 0;
  per_vertex_channels._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function
            (&local_368,get_mapping_func);
  ON_Mesh_Private_AddPerVertexMappingChannels
            (&local_368,mapping_ref,mappings_to_cache,material,&per_vertex_channels);
  std::_Function_base::~_Function_base(&local_368.super__Function_base);
  meshes._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008261e0;
  meshes.m_a = (ON_Mesh **)0x0;
  meshes.m_count = 0;
  meshes.m_capacity = 0;
  wcsMapping.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object = (_func_int **)mesh;
  ON_SimpleArray<const_ON_Mesh_*>::Append(&meshes,(ON_Mesh **)&wcsMapping);
  std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function
            (&local_3a8,get_mapping_func);
  lVar4 = 0;
  bVar8 = 0;
  bVar9 = 0;
  for (lVar3 = 0; lVar3 < (material->m_textures).super_ON_ClassArray<ON_Texture>.m_count;
      lVar3 = lVar3 + 1) {
    bVar1 = ON_Texture::IsWcsProjected
                      ((ON_Texture *)
                       ((long)&((ON_Texture *)
                               (&((ON_Texture *)
                                 (&((ON_Texture *)
                                   (&((material->m_textures).super_ON_ClassArray<ON_Texture>.m_a)->
                                     m_texture_id + -1))->m_texture_id + -1))->m_texture_id + -1))->
                               m_texture_id + lVar4 + 0xfffffffffffffff0U));
    bVar2 = ON_Texture::IsWcsBoxProjected
                      ((ON_Texture *)
                       ((long)&((ON_Texture *)
                               (&((ON_Texture *)
                                 (&((ON_Texture *)
                                   (&((material->m_textures).super_ON_ClassArray<ON_Texture>.m_a)->
                                     m_texture_id + -1))->m_texture_id + -1))->m_texture_id + -1))->
                               m_texture_id + lVar4 + 0xfffffffffffffff0U));
    bVar9 = bVar9 | bVar1;
    bVar8 = bVar8 | bVar2;
    lVar4 = lVar4 + 0x200;
  }
  if (bVar9 == 0) {
LAB_00518512:
    if (bVar8 == 0) goto LAB_0051867d;
    std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function
              ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)&uuidWcsMapping,&local_3a8
              );
    get_mapping_func_01.super__Function_base._M_functor._4_4_ = uVar7;
    get_mapping_func_01.super__Function_base._M_functor._0_4_ = uStack_3d8;
    get_mapping_func_01.super__Function_base._M_functor._8_8_ = mesh;
    get_mapping_func_01.super__Function_base._M_manager = (_Manager_type)mapping_ref;
    get_mapping_func_01._M_invoker = (_Invoker_type)meshes._vptr_ON_SimpleArray;
    GetOcsTransform(&ocsTransform,get_mapping_func_01,(ON_MappingRef *)&uuidWcsMapping);
    std::_Function_base::~_Function_base((_Function_base *)&uuidWcsMapping);
    uuidWcsBoxMapping = WcsMappingId(&ocsTransform,true);
    ON_TextureMapping::ON_TextureMapping(&wcsMapping);
    wcsMapping.m_type = wcsbox_projection;
    ON_ModelComponent::SetId(&wcsMapping.super_ON_ModelComponent,&uuidWcsBoxMapping);
    pOVar5 = &ocsTransform;
    pOVar6 = &wcsMapping.m_Pxyz;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pOVar6->m_xform[0][0] = pOVar5->m_xform[0][0];
      pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar10 * -2 + 1) * 8);
      pOVar6 = (ON_Xform *)((long)pOVar6 + (ulong)bVar10 * -0x10 + 8);
    }
    ON_Xform::GetSurfaceNormalXform(&wcsMapping.m_Pxyz,&wcsMapping.m_Nxyz);
    bVar1 = ON_TextureMapping::HasMatchingCachedTextureCoordinates(&wcsMapping,mesh,(ON_Xform *)0x0)
    ;
    if (!bVar1) {
      this = ON_ClassArray<ON_TextureCoordinates>::AppendNew(&mesh->m_TC);
      ON_TextureMapping::GetTextureCoordinates
                (&wcsMapping,mesh,&this->m_T,(ON_Xform *)0x0,false,(ON_SimpleArray<int> *)0x0);
      ON_MappingTag::Set(&this->m_tag,&wcsMapping);
      goto LAB_00518651;
    }
  }
  else {
    std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function
              ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)local_348,&local_3a8);
    get_mapping_func_00.super__Function_base._M_functor._4_4_ = uVar7;
    get_mapping_func_00.super__Function_base._M_functor._0_4_ = uStack_3d8;
    get_mapping_func_00.super__Function_base._M_functor._8_8_ = mesh;
    get_mapping_func_00.super__Function_base._M_manager = (_Manager_type)mapping_ref;
    get_mapping_func_00._M_invoker = (_Invoker_type)meshes._vptr_ON_SimpleArray;
    GetOcsTransform(&ocsTransform,get_mapping_func_00,(ON_MappingRef *)local_348);
    std::_Function_base::~_Function_base((_Function_base *)local_348);
    uuidWcsMapping = WcsMappingId(&ocsTransform,false);
    ON_TextureMapping::ON_TextureMapping(&wcsMapping);
    wcsMapping.m_type = wcs_projection;
    ON_ModelComponent::SetId(&wcsMapping.super_ON_ModelComponent,&uuidWcsMapping);
    pOVar5 = &ocsTransform;
    pOVar6 = &wcsMapping.m_Pxyz;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pOVar6->m_xform[0][0] = pOVar5->m_xform[0][0];
      pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar10 * -2 + 1) * 8);
      pOVar6 = (ON_Xform *)((long)pOVar6 + (ulong)bVar10 * -0x10 + 8);
    }
    bVar1 = ON_TextureMapping::HasMatchingCachedTextureCoordinates(&wcsMapping,mesh,(ON_Xform *)0x0)
    ;
    if (bVar1) {
      ON_TextureMapping::~ON_TextureMapping(&wcsMapping);
      goto LAB_00518512;
    }
    this = ON_ClassArray<ON_TextureCoordinates>::AppendNew(&mesh->m_TC);
    ON_TextureMapping::GetTextureCoordinates
              (&wcsMapping,mesh,&this->m_T,(ON_Xform *)0x0,false,(ON_SimpleArray<int> *)0x0);
    ON_MappingTag::Set(&this->m_tag,&wcsMapping);
LAB_00518651:
    pOVar5 = &ON_Xform::ZeroTransformation;
    pOVar6 = &(this->m_tag).m_mesh_xform;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pOVar6->m_xform[0][0] = pOVar5->m_xform[0][0];
      pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar10 * -2 + 1) * 8);
      pOVar6 = (ON_Xform *)((long)pOVar6 + (ulong)bVar10 * -0x10 + 8);
    }
    this->m_dim = 2;
  }
  ON_TextureMapping::~ON_TextureMapping(&wcsMapping);
LAB_0051867d:
  std::_Function_base::~_Function_base(&local_3a8.super__Function_base);
  ON_Mesh_Private_SetCachedTextureCoordinatesFromMaterial
            (&meshes,&per_vertex_channels,mapping_ref,perform_cleanup,(shared_ptr<CRhVboData> *)0x0)
  ;
  ON_SimpleArray<const_ON_Mesh_*>::~ON_SimpleArray(&meshes);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ON_TextureMapping>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&per_vertex_channels._M_h);
  return true;
}

Assistant:

bool SetCachedTextureCoordinatesFromMaterial(const ON_Mesh& mesh, std::function<ON_TextureMapping(const ON_MappingChannel*)> get_mapping_func, const ON_Material& material, const ON_MappingRef* mapping_ref, const ON_SimpleArray<ON_TextureMapping::TYPE>& mappings_to_cache, bool perform_cleanup)
{
  // Create a map of all texture mappings that require per-vertex texture coordinates
  std::unordered_map<unsigned int, ON_TextureMapping> per_vertex_channels;
  if (!ON_Mesh_Private_AddPerVertexMappingChannels(get_mapping_func, mapping_ref, mappings_to_cache, material, per_vertex_channels))
    return false;

  ON_SimpleArray<const ON_Mesh*> meshes;
  meshes.Append(&mesh);

  CacheWcsProjections(mesh, get_mapping_func, material, mapping_ref);

  return ON_Mesh_Private_SetCachedTextureCoordinatesFromMaterial(meshes, per_vertex_channels, mapping_ref, perform_cleanup, nullptr);
}